

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  int iVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  void *pvVar5;
  void *ptr_id;
  char *item_text;
  char *preview_value;
  void *local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  char *local_38;
  
  pIVar3 = GImGui;
  local_38 = (char *)0x0;
  iVar1 = *current_item;
  if (iVar1 < items_count && -1 < iVar1) {
    (*items_getter)(data,iVar1,&local_38);
  }
  if ((popup_max_height_in_items != -1) && (((pIVar3->NextWindowData).Flags & 0x10) == 0)) {
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_40.y = CalcMaxPopupHeightFromItemCount(popup_max_height_in_items);
    local_40.x = 3.4028235e+38;
    SetNextWindowSizeConstraints(&local_48,&local_40,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  bVar4 = BeginCombo(label,local_38,0);
  local_50 = (void *)0x0;
  if (bVar4) {
    local_50 = (void *)0x0;
    pvVar5 = (void *)(ulong)(uint)items_count;
    if (items_count < 1) {
      pvVar5 = (void *)0x0;
    }
    for (ptr_id = (void *)0x0; pvVar5 != ptr_id; ptr_id = (void *)((long)ptr_id + 1)) {
      PushID(ptr_id);
      uVar2 = *current_item;
      bVar4 = (*items_getter)(data,(int)ptr_id,(char **)&local_48);
      if (!bVar4) {
        local_48 = (ImVec2)0x19fd71;
      }
      local_40.x = 0.0;
      local_40.y = 0.0;
      bVar4 = Selectable((char *)local_48,ptr_id == (void *)(ulong)uVar2,0,&local_40);
      if (bVar4) {
        *current_item = (int)ptr_id;
        local_50 = (void *)0x1;
      }
      if (ptr_id == (void *)(ulong)uVar2) {
        SetItemDefaultFocus();
      }
      PopID();
    }
    EndPopup();
  }
  return SUB81(local_50,0);
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Call the getter to obtain the preview string which is a parameter to BeginCombo()
    const char* preview_value = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_value);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't have/need it, but we emulate it here.
    if (popup_max_height_in_items != -1 && !(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint))
        SetNextWindowSizeConstraints(ImVec2(0, 0), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));

    if (!BeginCombo(label, preview_value, ImGuiComboFlags_None))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    return value_changed;
}